

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_wrapper.cc
# Opt level: O2

Int __thiscall ipx::BasicLu::_Update(BasicLu *this,double pivot)

{
  double dVar1;
  double d;
  lu_int lVar2;
  Int IVar3;
  ostream *poVar4;
  pointer pdVar5;
  logic_error *this_00;
  double *xstore;
  char *pcVar6;
  string local_38;
  
  xstore = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = xstore[0x5d];
  while (lVar2 = basiclu_update((this->istore_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start,xstore,
                                (this->Li_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (this->Lx_).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (this->Ui_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (this->Ux_).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (this->Wi_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (this->Wx_).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,pivot), lVar2 == 1) {
    Reallocate(this);
    xstore = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (lVar2 == -6) {
    IVar3 = -1;
  }
  else {
    if (lVar2 != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"basiclu_update failed");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pdVar5 = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    d = pdVar5[0x5d];
    if ((10000000000.0 < d) && (dVar1 < d)) {
      poVar4 = Control::Debug(this->control_,3);
      pcVar6 = " max eta = ";
      poVar4 = std::operator<<(poVar4," max eta = ");
      sci2_abi_cxx11_(&local_38,(ipx *)pcVar6,d);
      poVar4 = std::operator<<(poVar4,(string *)&local_38);
      std::operator<<(poVar4,'\n');
      std::__cxx11::string::~string((string *)&local_38);
      pdVar5 = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    dVar1 = pdVar5[0x78];
    IVar3 = 0;
    if (1e-08 < dVar1) {
      poVar4 = Control::Debug(this->control_,3);
      pcVar6 = " relative error in new diagonal entry of U = ";
      poVar4 = std::operator<<(poVar4," relative error in new diagonal entry of U = ");
      sci2_abi_cxx11_(&local_38,(ipx *)pcVar6,dVar1);
      poVar4 = std::operator<<(poVar4,(string *)&local_38);
      std::operator<<(poVar4,'\n');
      std::__cxx11::string::~string((string *)&local_38);
      IVar3 = 1;
    }
  }
  return IVar3;
}

Assistant:

Int BasicLu::_Update(double pivot) {
    double max_eta_old = xstore_[BASICLU_MAX_ETA];
    Int status;
    for (;;) {
        status = basiclu_update(istore_.data(), xstore_.data(),
                                Li_.data(), Lx_.data(),
                                Ui_.data(), Ux_.data(),
                                Wi_.data(), Wx_.data(), pivot);
        if (status != BASICLU_REALLOCATE)
            break;
        Reallocate();
    }
    if (status != BASICLU_OK && status !=  BASICLU_ERROR_singular_update)
        throw std::logic_error("basiclu_update failed");
    if (status == BASICLU_ERROR_singular_update)
        return -1;

    // Print a debugging message if a new eta entry is large.
    double max_eta = xstore_[BASICLU_MAX_ETA];
    if (max_eta > 1e10 && max_eta > max_eta_old)
        control_.Debug(3) << " max eta = " << sci2(max_eta) << '\n';

    // stability check
    double pivot_error = xstore_[BASICLU_PIVOT_ERROR];
    if (pivot_error > kFtDiagErrorTol) {
        control_.Debug(3)
            << " relative error in new diagonal entry of U = "
            << sci2(pivot_error) << '\n';
        return 1;
    }
    return 0;
}